

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O3

int blake2s(void *out,size_t outlen,void *in,size_t inlen,void *key,size_t keylen)

{
  int iVar1;
  int iVar2;
  blake2s_state S [1];
  blake2s_state bStack_b8;
  
  iVar2 = -1;
  if ((out != (void *)0x0) && (in != (void *)0x0 || inlen == 0)) {
    if ((keylen < 0x21) &&
       ((0xffffffffffffffdf < outlen - 0x21 && (key != (void *)0x0 || keylen == 0)))) {
      if (keylen == 0) {
        iVar1 = blake2s_init(&bStack_b8,outlen);
      }
      else {
        iVar1 = blake2s_init_key(&bStack_b8,outlen,key,keylen);
      }
      if (-1 < iVar1) {
        blake2s_update(&bStack_b8,in,inlen);
        blake2s_final(&bStack_b8,out,outlen);
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int blake2s( void *out, size_t outlen, const void *in, size_t inlen, const void *key, size_t keylen )
{
  blake2s_state S[1];

  /* Verify parameters */
  if ( NULL == in && inlen > 0 ) return -1;

  if ( NULL == out ) return -1;

  if ( NULL == key && keylen > 0) return -1;

  if( !outlen || outlen > BLAKE2S_OUTBYTES ) return -1;

  if( keylen > BLAKE2S_KEYBYTES ) return -1;

  if( keylen > 0 )
  {
    if( blake2s_init_key( S, outlen, key, keylen ) < 0 ) return -1;
  }
  else
  {
    if( blake2s_init( S, outlen ) < 0 ) return -1;
  }

  blake2s_update( S, ( const uint8_t * )in, inlen );
  blake2s_final( S, out, outlen );
  return 0;
}